

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O0

void __thiscall SynthWidget::on_audioRecord_clicked(SynthWidget *this)

{
  QPushButton *pQVar1;
  bool bVar2;
  int iVar3;
  Master *this_00;
  QSettings *pQVar4;
  QString local_120;
  QDir local_108 [8];
  QString local_100;
  Int local_e4;
  QString local_e0;
  QString local_c8;
  undefined1 local_b0 [8];
  QString fileName;
  QString local_78;
  QVariant local_60;
  QFlag local_3c;
  QFlags<QFileDialog::Option> local_38 [2];
  Options qFileDialogOptions;
  QString local_28;
  SynthWidget *local_10;
  SynthWidget *this_local;
  
  local_10 = this;
  bVar2 = SynthRoute::isRecordingAudio(this->synthRoute);
  if (bVar2) {
    pQVar1 = (this->ui->super_Ui_SynthWidget).audioRecord;
    QString::QString(&local_28,"Record");
    QAbstractButton::setText((QString *)pQVar1);
    QString::~QString(&local_28);
    SynthRoute::stopRecordingAudio(this->synthRoute);
  }
  else {
    if (on_audioRecord_clicked()::currentDir == '\0') {
      iVar3 = __cxa_guard_acquire(&on_audioRecord_clicked()::currentDir);
      if (iVar3 != 0) {
        QString::QString(&on_audioRecord_clicked::currentDir,(char *)0x0);
        __cxa_atexit(QString::~QString,&on_audioRecord_clicked::currentDir,&__dso_handle);
        __cxa_guard_release(&on_audioRecord_clicked()::currentDir);
      }
    }
    this_00 = Master::getInstance();
    pQVar4 = Master::getSettings(this_00);
    QString::QString(&local_78,"Master/qFileDialogOptions");
    QVariant::QVariant((QVariant *)&fileName.d.size,0);
    QSettings::value((QString *)&local_60,(QVariant *)pQVar4);
    iVar3 = QVariant::toInt((bool *)&local_60);
    QFlag::QFlag(&local_3c,iVar3);
    QFlags<QFileDialog::Option>::QFlags(local_38,local_3c);
    QVariant::~QVariant(&local_60);
    QVariant::~QVariant((QVariant *)&fileName.d.size);
    QString::~QString(&local_78);
    QString::QString(&local_c8,(char *)0x0);
    QString::QString(&local_e0,"*.wav *.raw;;*.wav;;*.raw;;*.*");
    local_e4 = local_38[0].i;
    QFileDialog::getSaveFileName
              ((QWidget *)local_b0,(QString *)this,(QString *)&local_c8,
               (QString *)&on_audioRecord_clicked::currentDir,(QString *)&local_e0,
               (QFlags_conflict1 *)0x0);
    QString::~QString(&local_e0);
    QString::~QString(&local_c8);
    bVar2 = QString::isEmpty((QString *)local_b0);
    if (!bVar2) {
      QDir::QDir(local_108,(QString *)local_b0);
      QDir::absolutePath();
      QString::operator=(&on_audioRecord_clicked::currentDir,&local_100);
      QString::~QString(&local_100);
      QDir::~QDir(local_108);
      pQVar1 = (this->ui->super_Ui_SynthWidget).audioRecord;
      QString::QString(&local_120,"Stop");
      QAbstractButton::setText((QString *)pQVar1);
      QString::~QString(&local_120);
      SynthRoute::startRecordingAudio(this->synthRoute,(QString *)local_b0);
    }
    QString::~QString((QString *)local_b0);
  }
  return;
}

Assistant:

void SynthWidget::on_audioRecord_clicked() {
	if (synthRoute->isRecordingAudio()) {
		ui->audioRecord->setText("Record");
		synthRoute->stopRecordingAudio();
	} else {
		static QString currentDir = NULL;
		QFileDialog::Options qFileDialogOptions = QFileDialog::Options(Master::getInstance()->getSettings()->value("Master/qFileDialogOptions", 0).toInt());
		QString fileName = QFileDialog::getSaveFileName(this, NULL, currentDir, "*.wav *.raw;;*.wav;;*.raw;;*.*",
			NULL, qFileDialogOptions);
		if (!fileName.isEmpty()) {
			currentDir = QDir(fileName).absolutePath();
			ui->audioRecord->setText("Stop");
			synthRoute->startRecordingAudio(fileName);
		}
	}
}